

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::OutputComponentAliasingTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,OutputComponentAliasingTest *this,GLuint test_case_index)

{
  pointer ptVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  stringstream stream;
  stringstream asStack_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::OutputComponentAliasingTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::OutputComponentAliasingTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::operator<<(&local_198,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," type: ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2,", components: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," & ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string OutputComponentAliasingTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << " type: " << test_case.m_type.GetGLSLTypeName() << ", components: " << test_case.m_component_gohan
		   << " & " << test_case.m_component_goten;

	return stream.str();
}